

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

xml_output * attrTagT(char *name,triState v)

{
  long lVar1;
  int in_EDX;
  xml_output *in_RDI;
  long in_FS_OFFSET;
  xml_output *this;
  char *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == -1) {
    noxml();
    this = in_RDI;
  }
  else {
    this = in_RDI;
    QString::QString((QString *)in_RDI,in_stack_ffffffffffffffd8);
    QString::QString((QString *)this,in_stack_ffffffffffffffd8);
    tagValue((QString *)this,(QString *)in_RDI);
    QString::~QString((QString *)0x2444a4);
    QString::~QString((QString *)0x2444ae);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline XmlOutput::xml_output attrTagT(const char *name, const triState v)
{
    if(v == unset)
        return noxml();
    return tagValue(name, (v == _True ? "true" : "false"));
}